

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O1

void __thiscall
lts2::LBDOperator::fillBasisFunctionForIndex(LBDOperator *this,Mat *basisFunction,int idx)

{
  double dVar1;
  uint uVar2;
  IntegratingCell *pIVar3;
  Mat negImg;
  Mat ROI;
  Mat posImg;
  _InputArray local_2e8;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  _InputArray local_2b8 [4];
  _InputArray local_258 [4];
  Mat local_1f8 [96];
  long *local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  Mat local_128 [96];
  Mat local_c8 [152];
  
  local_2c0 = (this->_patchSize).width;
  local_2bc = (this->_patchSize).height;
  cv::Mat::create(basisFunction,&local_2c0,5);
  local_258[0].obj = &local_198;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = (long *)0x0;
  uStack_190 = 0;
  local_258[0].flags = -0x3efdfffa;
  local_258[0].sz.width = 1;
  local_258[0].sz.height = 4;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)basisFunction,local_258);
  cv::Mat::Mat((Mat *)local_258);
  local_2c8 = (this->_patchSize).width;
  local_2c4 = (this->_patchSize).height;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = (long *)0x0;
  uStack_190 = 0;
  cv::Mat::Mat(local_1f8,&local_2c8,5,&local_198);
  pIVar3 = this->_sensitiveCells;
  uVar2 = this->_basisFunctions[idx].pos_cell;
  local_2b8[0].flags = pIVar3[(int)uVar2].xmin;
  local_2b8[0]._4_4_ = pIVar3[(int)uVar2].ymin;
  dVar1 = pIVar3[(int)uVar2].scaleFactor;
  local_2b8[0].obj =
       (void *)CONCAT44(pIVar3[(int)uVar2].ymax - local_2b8[0]._4_4_,
                        pIVar3[(int)uVar2].xmax - local_2b8[0].flags);
  cv::Mat::Mat((Mat *)&local_198,local_1f8,(Rect_ *)local_2b8);
  cv::Mat::operator=((Mat *)local_258,(Mat *)&local_198);
  cv::Mat::~Mat((Mat *)&local_198);
  local_198 = (long *)(double)(float)dVar1;
  uStack_190 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_2b8[0].flags = -0x3efdfffa;
  local_2b8[0].sz.width = 1;
  local_2b8[0].sz.height = 4;
  local_2b8[0].obj = (Mat *)&local_198;
  cv::noArray();
  cv::Mat::setTo(local_258,local_2b8);
  local_2d0 = (this->_patchSize).width;
  local_2cc = (this->_patchSize).height;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = (long *)0x0;
  uStack_190 = 0;
  cv::Mat::Mat((Mat *)local_2b8,&local_2d0,5);
  pIVar3 = this->_sensitiveCells;
  uVar2 = this->_basisFunctions[idx].neg_cell;
  local_2e8.flags = pIVar3[(int)uVar2].xmin;
  local_2e8._4_4_ = pIVar3[(int)uVar2].ymin;
  dVar1 = pIVar3[(int)uVar2].scaleFactor;
  local_2e8.obj =
       (void *)CONCAT44(pIVar3[(int)uVar2].ymax - local_2e8._4_4_,
                        pIVar3[(int)uVar2].xmax - local_2e8.flags);
  cv::Mat::Mat((Mat *)&local_198,(Mat *)local_2b8,(Rect_ *)&local_2e8);
  cv::Mat::operator=((Mat *)local_258,(Mat *)&local_198);
  cv::Mat::~Mat((Mat *)&local_198);
  local_198 = (long *)(double)(float)dVar1;
  uStack_190 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_2e8.flags = -0x3efdfffa;
  local_2e8.sz.width = 1;
  local_2e8.sz.height = 4;
  local_2e8.obj = (Mat *)&local_198;
  cv::noArray();
  cv::Mat::setTo(local_258,&local_2e8);
  cv::operator-((Mat *)&local_198,local_1f8);
  (**(code **)(*local_198 + 0x18))(local_198,&local_198,basisFunction,0xffffffff);
  cv::Mat::~Mat(local_c8);
  cv::Mat::~Mat(local_128);
  cv::Mat::~Mat((Mat *)&local_188);
  cv::Mat::~Mat((Mat *)local_2b8);
  cv::Mat::~Mat(local_1f8);
  cv::Mat::~Mat((Mat *)local_258);
  return;
}

Assistant:

void lts2::LBDOperator::fillBasisFunctionForIndex(cv::Mat &basisFunction, int idx) const
{
    // Output
    basisFunction.create(_patchSize, CV_32FC1);
    basisFunction.setTo(cv::Scalar(0));
    
    // Local structures needed
    lbd::IntegratingCell cell;
    int cellId;
    cv::Mat ROI;
    float value;

    //---------------//
    // Positive part //
    //---------------//
    
    cv::Mat posImg(_patchSize, CV_32F, cv::Scalar(0));
    cellId = _basisFunctions[idx].pos_cell;
    cell = _sensitiveCells[cellId];
    value = cv::saturate_cast<float>(cell.scaleFactor);
    
    // Extract ROI
    ROI = posImg(cv::Rect(cell.xmin, cell.ymin, 
                          cell.xmax-cell.xmin, cell.ymax-cell.ymin));
    
    // Set ROI to the correct value
    ROI.setTo(cv::Scalar(value));

    //---------------//
    // Negative part //
    //---------------//

    cv::Mat negImg(_patchSize, CV_32F, cv::Scalar(0));
    cellId = _basisFunctions[idx].neg_cell;
    cell = _sensitiveCells[cellId];
    value = cv::saturate_cast<float>(cell.scaleFactor);

    // Extract ROI
    ROI = negImg(cv::Rect(cell.xmin, cell.ymin, 
                          cell.xmax-cell.xmin, cell.ymax-cell.ymin));
    
    // Set ROI to the correct value
    ROI.setTo(cv::Scalar(value));
    
    //--------------//
    // Combine both //
    //--------------//
    basisFunction = posImg - negImg;
}